

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::WriteIndent(TextGenerator *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  LogMessage *other;
  LogMessage local_70;
  char *local_38;
  void *void_buffer;
  
  if (this->indent_level_ != 0) {
    if (this->failed_ == true) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/text_format.cc"
                 ,0x520);
      other = internal::LogMessage::operator<<(&local_70,"CHECK failed: !failed_: ");
      internal::LogFinisher::operator=((LogFinisher *)&local_38,other);
      internal::LogMessage::~LogMessage(&local_70);
    }
    iVar3 = (*(this->super_BaseTextGenerator)._vptr_BaseTextGenerator[4])(this);
    uVar4 = this->buffer_size_;
    if ((int)uVar4 < iVar3) {
      do {
        if (0 < (int)uVar4) {
          memset(this->buffer_,0x20,(ulong)uVar4);
        }
        iVar1 = this->buffer_size_;
        iVar5 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                          (this->output_,&local_38,&this->buffer_size_);
        bVar2 = (bool)((byte)iVar5 ^ 1);
        this->failed_ = bVar2;
        if (bVar2 != false) {
          return;
        }
        iVar3 = iVar3 - iVar1;
        this->buffer_ = local_38;
        uVar4 = this->buffer_size_;
      } while ((int)uVar4 < iVar3);
    }
    memset(this->buffer_,0x20,(long)iVar3);
    this->buffer_ = this->buffer_ + iVar3;
    this->buffer_size_ = this->buffer_size_ - iVar3;
  }
  return;
}

Assistant:

void WriteIndent() {
    if (indent_level_ == 0) {
      return;
    }
    GOOGLE_DCHECK(!failed_);
    int size = GetCurrentIndentationSize();

    while (size > buffer_size_) {
      // Data exceeds space in the buffer. Write what we can and request a new
      // buffer.
      if (buffer_size_ > 0) {
        memset(buffer_, ' ', buffer_size_);
      }
      size -= buffer_size_;
      void* void_buffer;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memset(buffer_, ' ', size);
    buffer_ += size;
    buffer_size_ -= size;
  }